

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O0

bool vkt::pipeline::isVertexFormatSRGB(VkFormat format)

{
  bool local_9;
  VkFormat format_local;
  
  if ((((format == VK_FORMAT_R8_SRGB) || (format == VK_FORMAT_R8G8_SRGB)) ||
      (format == VK_FORMAT_R8G8B8_SRGB)) ||
     (((format == VK_FORMAT_B8G8R8_SRGB || (format == VK_FORMAT_R8G8B8A8_SRGB)) ||
      (format == VK_FORMAT_B8G8R8A8_SRGB)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool isVertexFormatSRGB (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_R8_SRGB:
		case VK_FORMAT_R8G8_SRGB:
		case VK_FORMAT_R8G8B8_SRGB:
		case VK_FORMAT_B8G8R8_SRGB:
		case VK_FORMAT_R8G8B8A8_SRGB:
		case VK_FORMAT_B8G8R8A8_SRGB:
			return true;

		default:
			break;
	}

	return false;

}